

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

bool __thiscall
ON_SimpleArray<VertexToDuplicate>::QuickSortAndRemoveDuplicates
          (ON_SimpleArray<VertexToDuplicate> *this,
          _func_int_VertexToDuplicate_ptr_VertexToDuplicate_ptr *compar)

{
  uint uVar1;
  int iVar2;
  VertexToDuplicate *pVVar3;
  VertexToDuplicate *pVVar4;
  int local_30;
  int local_2c;
  int i;
  int clean_count;
  VertexToDuplicate *prev_ele;
  bool rc;
  _func_int_VertexToDuplicate_ptr_VertexToDuplicate_ptr *compar_local;
  ON_SimpleArray<VertexToDuplicate> *this_local;
  
  prev_ele._7_1_ = false;
  if (((this->m_a != (VertexToDuplicate *)0x0) && (0 < this->m_count)) &&
     (compar != (_func_int_VertexToDuplicate_ptr_VertexToDuplicate_ptr *)0x0)) {
    if (1 < this->m_count) {
      ON_qsort(this->m_a,(long)this->m_count,0x20,(_func_int_void_ptr_void_ptr *)compar);
      _i = this->m_a;
      local_2c = 1;
      for (local_30 = 1; local_30 < this->m_count; local_30 = local_30 + 1) {
        iVar2 = (*compar)(_i,this->m_a + local_30);
        if (iVar2 != 0) {
          if (local_2c < local_30) {
            pVVar4 = this->m_a + local_30;
            pVVar3 = this->m_a + local_2c;
            pVVar3->m_vertex = pVVar4->m_vertex;
            pVVar3->m_face = pVVar4->m_face;
            uVar1 = pVVar4->m_mesh_V_index;
            pVVar3->m_sector_id = pVVar4->m_sector_id;
            pVVar3->m_mesh_V_index = uVar1;
            pVVar3->m_mesh_F_index = pVVar4->m_mesh_F_index;
          }
          _i = this->m_a + local_2c;
          local_2c = local_2c + 1;
        }
      }
      if (local_2c < this->m_count) {
        memset(this->m_a + local_2c,0,(long)(this->m_count - local_2c) << 5);
        SetCount(this,local_2c);
      }
    }
    prev_ele._7_1_ = true;
  }
  return prev_ele._7_1_;
}

Assistant:

bool ON_SimpleArray<T>::QuickSortAndRemoveDuplicates( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar )
  {
    if (m_count > 1)
    {
      ON_qsort(m_a, m_count, sizeof(T), (int(*)(const void*, const void*))compar);
      const T* prev_ele = &m_a[0];
      int clean_count = 1;
      for (int i = 1; i < m_count; ++i)
      {
        if (0 == compar(prev_ele, &m_a[i]))
          continue; // duplicate
        if (i > clean_count)
          m_a[clean_count] = m_a[i];
        prev_ele = &m_a[clean_count];
        ++clean_count;
      }
      if (clean_count < m_count)
      {
        memset( (void*)(&m_a[clean_count]), 0, (m_count-clean_count)*sizeof(T) );
        SetCount(clean_count);
      }
    }
    rc = true;
  }
  return rc;
}